

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaTargetGenerator::cmNinjaTargetGenerator
          (cmNinjaTargetGenerator *this,cmGeneratorTarget *target)

{
  cmLocalNinjaGenerator *pcVar1;
  unique_ptr<cmNinjaTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>_>
  local_30 [3];
  cmGeneratorTarget *local_18;
  cmGeneratorTarget *target_local;
  cmNinjaTargetGenerator *this_local;
  
  local_18 = target;
  target_local = (cmGeneratorTarget *)this;
  cmCommonTargetGenerator::cmCommonTargetGenerator(&this->super_cmCommonTargetGenerator,target);
  (this->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator =
       (_func_int **)&PTR__cmNinjaTargetGenerator_00ae7e60;
  std::
  unique_ptr<cmNinjaTargetGenerator::MacOSXContentGeneratorType,std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>>
  ::unique_ptr<std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>,void>
            ((unique_ptr<cmNinjaTargetGenerator::MacOSXContentGeneratorType,std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>>
              *)&this->MacOSXContentGenerator,(nullptr_t)0x0);
  std::unique_ptr<cmOSXBundleGenerator,std::default_delete<cmOSXBundleGenerator>>::
  unique_ptr<std::default_delete<cmOSXBundleGenerator>,void>
            ((unique_ptr<cmOSXBundleGenerator,std::default_delete<cmOSXBundleGenerator>> *)
             &this->OSXBundleGenerator,(nullptr_t)0x0);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->MacContentFolders);
  pcVar1 = (cmLocalNinjaGenerator *)cmGeneratorTarget::GetLocalGenerator(local_18);
  this->LocalGenerator = pcVar1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Objects);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::map(&this->DDIFiles);
  Json::Value::Value(&this->SwiftOutputMap,nullValue);
  std::vector<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>::vector
            (&this->CustomCommands);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->ExtraFiles);
  std::make_unique<cmNinjaTargetGenerator::MacOSXContentGeneratorType,cmNinjaTargetGenerator*>
            ((cmNinjaTargetGenerator **)local_30);
  std::
  unique_ptr<cmNinjaTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>_>
  ::operator=(&this->MacOSXContentGenerator,local_30);
  std::
  unique_ptr<cmNinjaTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmNinjaTargetGenerator::MacOSXContentGeneratorType>_>
  ::~unique_ptr(local_30);
  return;
}

Assistant:

cmNinjaTargetGenerator::cmNinjaTargetGenerator(cmGeneratorTarget* target)
  : cmCommonTargetGenerator(target)
  , MacOSXContentGenerator(nullptr)
  , OSXBundleGenerator(nullptr)
  , LocalGenerator(
      static_cast<cmLocalNinjaGenerator*>(target->GetLocalGenerator()))
{
  MacOSXContentGenerator = cm::make_unique<MacOSXContentGeneratorType>(this);
}